

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2_builder.cpp
# Opt level: O0

UBool copyEnumRange(void *context,UChar32 start,UChar32 end,uint32_t value)

{
  NewTrieAndStatus *nt;
  undefined4 local_20;
  uint32_t value_local;
  UChar32 end_local;
  UChar32 start_local;
  void *context_local;
  
  if (value == *(uint32_t *)(*context + 0x24)) {
    context_local._7_1_ = '\x01';
  }
  else {
    local_20 = end;
    if (*(char *)((long)context + 0xc) != '\0') {
      local_20 = end + -1;
    }
    if (start == local_20) {
      utrie2_set32_63(*context,start,value,(UErrorCode *)((long)context + 8));
    }
    else {
      utrie2_setRange32_63(*context,start,local_20,value,'\x01',(UErrorCode *)((long)context + 8));
    }
    context_local._7_1_ = U_SUCCESS(*(UErrorCode *)((long)context + 8));
  }
  return context_local._7_1_;
}

Assistant:

static UBool U_CALLCONV
copyEnumRange(const void *context, UChar32 start, UChar32 end, uint32_t value) {
    NewTrieAndStatus *nt=(NewTrieAndStatus *)context;
    if(value!=nt->trie->initialValue) {
        if(nt->exclusiveLimit) {
            --end;
        }
        if(start==end) {
            utrie2_set32(nt->trie, start, value, &nt->errorCode);
        } else {
            utrie2_setRange32(nt->trie, start, end, value, TRUE, &nt->errorCode);
        }
        return U_SUCCESS(nt->errorCode);
    } else {
        return TRUE;
    }
}